

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_layout_qualifiers
               (NegativeTestContext *ctx)

{
  undefined1 *this;
  RenderContext *pRVar1;
  TestLog *log;
  bool bVar2;
  ContextType ctxType;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  allocator<char> local_411;
  ComputeSource compSource;
  ShaderProgram program_3;
  ostringstream compShaderSource;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&compShaderSource);
  poVar4 = std::operator<<((ostream *)&compShaderSource,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource(&compSource,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&program_3,0,0xac);
  program_3.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  program_3.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
  program_3.m_program.m_info.infoLog.field_2._9_7_ = 0;
  program_3.m_program.m_info.linkOk = false;
  program_3.m_program.m_info._33_8_ = 0;
  pPVar5 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&program_3,&compSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,pPVar5);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_3,
             "A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size."
             ,&local_411);
  NegativeTestContext::beginSection(ctx,(string *)&program_3);
  std::__cxx11::string::~string((string *)&program_3);
  verifyLinkError(ctx,&program);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compShaderSource);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&compShaderSource);
  poVar4 = std::operator<<((ostream *)&compShaderSource,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource(&compSource,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&program_3,0,0xac);
  program_3.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  program_3.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
  program_3.m_program.m_info.infoLog.field_2._9_7_ = 0;
  program_3.m_program.m_info.linkOk = false;
  program_3.m_program.m_info._33_8_ = 0;
  pPVar5 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&program_3,&compSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,pPVar5);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_3,
             "A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader."
             ,&local_411);
  NegativeTestContext::beginSection(ctx,(string *)&program_3);
  std::__cxx11::string::~string((string *)&program_3);
  verifyCompileError(ctx,&program,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compShaderSource);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&compShaderSource);
  poVar4 = std::operator<<((ostream *)&compShaderSource,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"out mediump vec4 fragColor;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource(&compSource,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&program_3,0,0xac);
  program_3.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  program_3.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
  program_3.m_program.m_info.infoLog.field_2._9_7_ = 0;
  program_3.m_program.m_info.linkOk = false;
  program_3.m_program.m_info._33_8_ = 0;
  pPVar5 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&program_3,&compSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,pPVar5);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_3,
             "A compile-time error is generated if a user defined output variable is declared in a compute shader."
             ,&local_411);
  NegativeTestContext::beginSection(ctx,(string *)&program_3);
  std::__cxx11::string::~string((string *)&program_3);
  verifyCompileError(ctx,&program,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compShaderSource);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  poVar4 = std::operator<<((ostream *)&program,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_NumWorkGroups;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_WorkGroupSize;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_WorkGroupID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_LocalInvocationID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_GlobalInvocationID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_LocalInvocationIndex;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource(&compSource,(string *)&compShaderSource);
  std::__cxx11::string::~string((string *)&compShaderSource);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&compShaderSource,0,0xac);
  compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = 0;
  compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._184_1_ = 0;
  compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._185_7_ = 0;
  compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._192_1_ = 0;
  compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._193_8_ = 0;
  pPVar5 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&compShaderSource,&compSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&program_3,pRVar1,pPVar5);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&compShaderSource);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compShaderSource,
             "A compile time or link error is generated if compute shader built-in variables are redeclared."
             ,&local_411);
  NegativeTestContext::beginSection(ctx,(string *)&compShaderSource);
  std::__cxx11::string::~string((string *)&compShaderSource);
  log = (ctx->super_CallLogWrapper).m_log;
  glu::operator<<(log,&program_3);
  if ((program_3.m_program.m_info.linkOk == true) &&
     (((*program_3.m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true)) {
    this = &compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    compShaderSource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"Program was not expected to compile or link.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&compShaderSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compShaderSource,"Program was not expected to compile or link.",&local_411
              );
    NegativeTestContext::fail(ctx,(string *)&compShaderSource);
    std::__cxx11::string::~string((string *)&compShaderSource);
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program_3);
  std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  return;
}

Assistant:

void invalid_layout_qualifiers (NegativeTestContext& ctx)
{
	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size.");
		verifyLinkError(ctx, program);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"out mediump vec4 fragColor;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a user defined output variable is declared in a compute shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"uvec3 gl_NumWorkGroups;\n"
							<<	"uvec3 gl_WorkGroupSize;\n"
							<<	"uvec3 gl_WorkGroupID;\n"
							<<	"uvec3 gl_LocalInvocationID;\n"
							<<	"uvec3 gl_GlobalInvocationID;\n"
							<<	"uvec3 gl_LocalInvocationIndex;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile time or link error is generated if compute shader built-in variables are redeclared.");
		bool testFailed = false;

		tcu::TestLog& log = ctx.getLog();
		log << program;

		testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

		if (testFailed)
		{
			const char* const message("Program was not expected to compile or link.");
			log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
			ctx.fail(message);
		}

		ctx.endSection();
	}
}